

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

DecompressResult
tcu::astc::anon_unknown_0::decompressBlock
          (void *dst,Block128 *blockData,int blockWidth,int blockHeight,bool isSRGB,bool isLDR)

{
  ColorEndpointPair *e0;
  undefined8 *puVar1;
  uint *puVar2;
  Word WVar3;
  byte bVar4;
  ushort uVar8;
  short sVar9;
  sbyte sVar10;
  short sVar11;
  int i;
  uint uVar12;
  int iVar13;
  DecompressResult DVar14;
  ISEParams IVar15;
  long lVar16;
  InternalError *this;
  uint uVar17;
  deUint32 dVar18;
  long lVar19;
  int iVar20;
  deUint32 dst_1;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  deUint32 *pdVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  deUint32 dVar33;
  int c;
  uint uVar34;
  int iVar35;
  uint uVar36;
  UVec4 *e1;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  bool bVar41;
  float fVar42;
  undefined1 auVar43 [16];
  byte local_a58;
  ASTCBlockMode blockMode;
  deUint32 colorEndpointModes [4];
  ColorEndpointPair colorEndpoints [4];
  ISEParams local_8b8 [32];
  deUint32 rgba [4];
  bool local_7a8 [4];
  int local_7a4;
  deUint32 local_7a0;
  uint local_79c [185];
  TexelWeightPair texelWeights [144];
  byte bVar5;
  char cVar6;
  char cVar7;
  
  uVar39 = blockData->m_words[0];
  uVar12 = (uint)uVar39;
  uVar40 = uVar39 & 0xffffffff;
  if ((uVar12 & 0x1ff) == 0x1fc) {
    if (((byte)(uVar39 >> 9) & isLDR) == 0) {
      WVar3 = blockData->m_words[1];
      uVar23 = (uint)(uVar39 >> 0x19) & 0x1fff;
      uVar17 = (uint)(uVar39 >> 0x20);
      uVar21 = uVar17 >> 0x13;
      uVar17 = uVar17 >> 6;
      if (((uVar21 == 0x1fff) && ((uVar12 >> 0xc & uVar17 & uVar23) == 0x1fff)) ||
         ((uVar12 >> 0xc & 0x1fff) < uVar23 && (uVar17 & 0x1fff) < uVar21)) {
        rgba._0_8_ = CONCAT44((int)(WVar3 >> 0x10),(int)WVar3) & 0xffff0000ffff;
        rgba[2] = (uint)(WVar3 >> 0x20) & 0xffff;
        uVar8 = (ushort)(WVar3 >> 0x30);
        rgba[3] = (deUint32)uVar8;
        if (isSRGB) {
          if (0 < blockHeight * blockWidth) {
            auVar43._0_4_ = rgba[0] >> 8;
            auVar43._4_4_ = rgba[1] >> 8;
            auVar43._8_4_ = rgba[2] >> 8;
            auVar43._12_2_ = uVar8 >> 8;
            auVar43._14_2_ = 0;
            auVar43 = auVar43 & _DAT_01b723d0;
            uVar8 = auVar43._0_2_;
            bVar4 = (uVar8 != 0) * (uVar8 < 0x100) * auVar43[0] - (0xff < uVar8);
            uVar8 = auVar43._4_2_;
            bVar5 = (uVar8 != 0) * (uVar8 < 0x100) * auVar43[4] - (0xff < uVar8);
            sVar9 = auVar43._8_2_;
            cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar43[8] - (0xff < sVar9);
            sVar9 = auVar43._10_2_;
            sVar11 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar43[10] - (0xff < sVar9),cVar6);
            sVar9 = auVar43._12_2_;
            cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar43[0xc] - (0xff < sVar9);
            sVar9 = auVar43._14_2_;
            sVar9 = (short)(CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar43[0xe] - (0xff < sVar9),
                                     CONCAT12(cVar7,sVar11)) >> 0x10);
            lVar19 = 0;
            do {
              *(uint *)((long)dst + (long)(int)lVar19) =
                   CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar7 - (0xff < sVar9),
                            CONCAT12((0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11),
                                     CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5),
                                              (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
              lVar19 = lVar19 + 4;
            } while ((ulong)(uint)(blockHeight * blockWidth) << 2 != lVar19);
          }
        }
        else if ((uVar12 >> 9 & 1) == 0) {
          if (0 < blockHeight * blockWidth) {
            lVar19 = 0;
            do {
              puVar2 = (uint *)((long)dst + (long)(int)lVar19 * 4);
              *puVar2 = -(uint)(rgba[0] == 0xffff) & 0x3f800000 |
                        ~-(uint)(rgba[0] == 0xffff) &
                        (uint)(((float)(rgba[0] | 0x4b000000) + -8388608.0) * 1.5258789e-05);
              puVar2[1] = -(uint)(rgba[1] == 0xffff) & 0x3f800000 |
                          ~-(uint)(rgba[1] == 0xffff) &
                          (uint)(((float)(rgba[1] | 0x4b000000) + -8388608.0) * 1.5258789e-05);
              puVar2[2] = -(uint)(rgba[2] == 0xffff) & 0x3f800000 |
                          ~-(uint)(rgba[2] == 0xffff) &
                          (uint)(((float)(rgba[2] | 0x4b000000) + -8388608.0) * 1.5258789e-05);
              puVar2[3] = -(uint)(rgba[3] == 0xffff) & 0x3f800000 |
                          ~-(uint)(rgba[3] == 0xffff) &
                          (uint)(((float)(rgba[3] | 0x4b000000) + -8388608.0) * 1.5258789e-05);
              lVar19 = lVar19 + 4;
            } while ((ulong)(uint)(blockHeight * blockWidth) << 2 != lVar19);
          }
        }
        else {
          lVar19 = 0;
          do {
            if ((~rgba[lVar19] & 0x7c00) == 0) {
              this = (InternalError *)__cxa_allocate_exception(0x38);
              texelWeights[0].w = (deUint32  [2])(texelWeights + 2);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)texelWeights,
                         "Infinity or NaN color component in HDR void extent block in ASTC texture (behavior undefined by ASTC specification)"
                         ,"");
              InternalError::InternalError(this,(string *)texelWeights);
              __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != 4);
          if (0 < blockHeight * blockWidth) {
            iVar35 = 0;
            uVar39 = 0;
            do {
              lVar19 = 0;
              do {
                fVar42 = deFloat16To32((deFloat16)rgba[lVar19]);
                *(float *)((long)dst + lVar19 * 4 + (long)iVar35 * 4) = fVar42;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              uVar39 = uVar39 + 1;
              iVar35 = iVar35 + 4;
            } while (uVar39 != (uint)(blockHeight * blockWidth));
          }
        }
        return DECOMPRESS_RESULT_VALID_BLOCK;
      }
    }
    uVar12 = blockHeight * blockWidth;
    if (!isSRGB) {
      if ((int)uVar12 < 1) {
        return DECOMPRESS_RESULT_ERROR;
      }
      lVar19 = 0;
      do {
        puVar1 = (undefined8 *)((long)dst + (long)(int)lVar19 * 4);
        *puVar1 = 0x3f800000;
        puVar1[1] = 0x3f8000003f800000;
        lVar19 = lVar19 + 4;
      } while ((ulong)uVar12 << 2 != lVar19);
      return DECOMPRESS_RESULT_ERROR;
    }
    if ((int)uVar12 < 1) {
      return DECOMPRESS_RESULT_ERROR;
    }
    lVar19 = 0;
    do {
      *(undefined4 *)((long)dst + (long)(int)lVar19) = 0xffff00ff;
      lVar19 = lVar19 + 4;
    } while ((ulong)uVar12 << 2 != lVar19);
    return DECOMPRESS_RESULT_ERROR;
  }
  uVar17 = uVar12 & 0x7ff;
  if ((uVar39 & 3) != 0) {
    if ((uVar39 & 0xf) == 0) goto LAB_019c7d95;
    uVar21 = (uint)(uVar40 >> 2) & 3;
    uVar23 = (uint)(uVar40 >> 5) & 3;
    if (uVar21 == 3) {
      uVar30 = uVar17 >> 7 & 1;
      uVar31 = uVar30 | 6;
      uVar21 = uVar23 + 2;
      if ((uVar12 >> 8 & 1) != 0) {
        uVar21 = uVar30 + 2;
        uVar31 = uVar23 + 2;
      }
    }
    else {
      uVar31 = uVar17 >> 7 & 3;
      if (uVar21 == 2) {
        uVar21 = uVar23 + 2;
        uVar31 = uVar31 | 8;
      }
      else {
        if (uVar21 == 1) {
          uVar21 = uVar31 | 8;
        }
        else {
          uVar21 = uVar31 | 4;
        }
        uVar31 = uVar23 + 2;
      }
    }
    uVar23 = ((uint)(uVar40 >> 4) & 1) + (uVar12 & 3) * 2;
LAB_019c8003:
    local_a58 = (byte)(uVar17 >> 10);
    if ((uVar12 >> 9 & 1) == 0) goto LAB_019c8118;
    switch(uVar23) {
    case 2:
      iVar35 = 1;
      goto LAB_019c8172;
    case 3:
      iVar35 = 2;
      goto LAB_019c81d5;
    case 4:
      break;
    case 5:
      iVar35 = 2;
LAB_019c8172:
      uVar30 = uVar31 * uVar21 << local_a58;
      iVar35 = (uVar30 * iVar35 + (uVar30 * 0x2555a >> 0x10) + 1) -
               (uint)((uVar30 * -0x5553 & 0xffff) < 0x5556);
      uVar17 = 1;
      goto LAB_019c8260;
    case 6:
      iVar35 = 3;
      goto LAB_019c81d5;
    case 7:
      uVar23 = 5;
      break;
    default:
      goto switchD_019c803f_default;
    }
    goto switchD_019c803f_caseD_4;
  }
  if ((uVar39 & 0xc) == 0 || (~uVar12 & 0x1c0) == 0) {
LAB_019c7d95:
    uVar12 = blockHeight * blockWidth;
    if (!isSRGB) {
      if ((int)uVar12 < 1) {
        return DECOMPRESS_RESULT_ERROR;
      }
      lVar19 = 0;
      do {
        puVar1 = (undefined8 *)((long)dst + (long)(int)lVar19 * 4);
        *puVar1 = 0x3f800000;
        puVar1[1] = 0x3f8000003f800000;
        lVar19 = lVar19 + 4;
      } while ((ulong)uVar12 << 2 != lVar19);
      return DECOMPRESS_RESULT_ERROR;
    }
    if ((int)uVar12 < 1) {
      return DECOMPRESS_RESULT_ERROR;
    }
    lVar19 = 0;
    do {
      *(undefined4 *)((long)dst + (long)(int)lVar19) = 0xffff00ff;
      lVar19 = lVar19 + 4;
    } while ((ulong)uVar12 << 2 != lVar19);
    return DECOMPRESS_RESULT_ERROR;
  }
  uVar23 = (uint)(uVar40 >> 7) & 3;
  if (uVar23 == 3) {
    uVar21 = ((uVar12 & 0x20) >> 3) + 6;
    uVar31 = (uint)((uVar39 & 0x20) == 0) * 4 + 6;
  }
  else {
    uVar21 = (uint)(uVar40 >> 5) & 3;
    if (uVar23 == 2) {
      uVar21 = uVar21 + 6;
      uVar31 = (uVar17 >> 9) + 6;
    }
    else if (uVar23 == 1) {
      uVar21 = uVar21 + 2;
      uVar31 = 0xc;
    }
    else {
      uVar31 = uVar21 + 2;
      uVar21 = 0xc;
    }
  }
  uVar23 = (uint)(uVar40 >> 1) & 6 | (uint)(uVar40 >> 4) & 1;
  if ((uVar12 & 0x180) != 0x100) goto LAB_019c8003;
  local_a58 = 0;
LAB_019c8118:
  switch(uVar23) {
  case 2:
    uVar23 = 1;
    break;
  case 3:
    iVar35 = 0;
    goto LAB_019c81d5;
  case 4:
    uVar23 = 2;
    break;
  case 5:
    iVar35 = 0;
    goto LAB_019c8172;
  case 6:
    iVar35 = 1;
LAB_019c81d5:
    uVar30 = uVar31 * uVar21 << local_a58;
    iVar35 = (uVar30 * iVar35 + (uVar30 * 0x199a0 >> 0x10) + 1) -
             (uint)((uVar30 * -0x19998 & 0xffff) < 0x3334);
    uVar17 = 0;
    goto LAB_019c8260;
  case 7:
    uVar23 = 3;
    break;
  default:
switchD_019c803f_default:
    uVar23 = 0;
    goto LAB_019c822f;
  }
switchD_019c803f_caseD_4:
LAB_019c822f:
  uVar30 = uVar31 * uVar21 << local_a58;
  iVar35 = uVar30 * uVar23;
  uVar17 = 2;
LAB_019c8260:
  if (((0x40 < uVar30) || (iVar35 - 0x61U < 0xffffffb7)) ||
     ((blockWidth < (int)uVar21 || (blockHeight < (int)uVar31)))) {
LAB_019c82b6:
    uVar12 = blockHeight * blockWidth;
    if (!isSRGB) {
      if ((int)uVar12 < 1) {
        return DECOMPRESS_RESULT_ERROR;
      }
      lVar19 = 0;
      do {
        puVar1 = (undefined8 *)((long)dst + (long)(int)lVar19 * 4);
        *puVar1 = 0x3f800000;
        puVar1[1] = 0x3f8000003f800000;
        lVar19 = lVar19 + 4;
      } while ((ulong)uVar12 << 2 != lVar19);
      return DECOMPRESS_RESULT_ERROR;
    }
    if ((int)uVar12 < 1) {
      return DECOMPRESS_RESULT_ERROR;
    }
    lVar19 = 0;
    do {
      *(undefined4 *)((long)dst + (long)(int)lVar19) = 0xffff00ff;
      lVar19 = lVar19 + 4;
    } while ((ulong)uVar12 << 2 != lVar19);
    return DECOMPRESS_RESULT_ERROR;
  }
  uVar23 = (uint)(uVar39 >> 0xb) & 3;
  uVar21 = uVar23 + 1;
  uVar40 = (ulong)uVar21;
  if (uVar21 == 4) {
    if (local_a58 != 0) goto LAB_019c82b6;
    if ((uVar39 & 0x1800000) == 0) {
LAB_019c83d3:
      dVar33 = ((uint)(local_a58 ^ 1) * 2 + 0x61) - iVar35;
      iVar35 = 0x80 - iVar35;
    }
    else {
      dVar33 = 0x5b - iVar35;
      iVar25 = -7;
LAB_019c83c5:
      iVar35 = (iVar25 - iVar35) + 0x7f;
    }
  }
  else {
    if ((uVar39 >> 0xb & 3) == 0) {
      dVar33 = ((uint)(local_a58 ^ 1) * 2 + 0x6d) - iVar35;
      colorEndpointModes[0] = uVar12 >> 0xd & 0xf;
      bVar41 = true;
      uVar40 = 1;
      goto LAB_019c860d;
    }
    if ((uVar39 & 0x1800000) == 0) goto LAB_019c83d3;
    dVar33 = (((uint)(local_a58 ^ 1) * 2 + 0x65) - iVar35) + uVar21 * -3;
    iVar25 = -4;
    if (uVar21 == 3) goto LAB_019c83c5;
    iVar35 = 0x7e - iVar35;
  }
  if ((uVar39 >> 0x17 & 3) == 0) {
    colorEndpointModes[0] = uVar12 >> 0x19 & 0xf;
    if (-0x80000000 < (int)(uVar23 | 0x80000000)) {
      colorEndpointModes[1] = colorEndpointModes[0];
    }
    if (1 < uVar23) {
      colorEndpointModes[2] = colorEndpointModes[0];
    }
    if (2 < uVar23) {
      colorEndpointModes[3] = colorEndpointModes[0];
    }
    bVar41 = false;
  }
  else {
    uVar27 = 0x19;
    lVar19 = 0;
    do {
      iVar25 = (int)uVar27;
      iVar28 = iVar25 + 0x3f;
      if (-1 < iVar25) {
        iVar28 = iVar25;
      }
      iVar25 = (int)lVar19;
      iVar13 = iVar35 + -4;
      if (iVar25 + uVar23 + 1 < 4) {
        iVar13 = 0x19;
      }
      uVar21 = iVar13 + iVar25 + uVar23 + 1;
      uVar12 = iVar25 + uVar23 + iVar13 + 0x40;
      if (-1 < (int)uVar21) {
        uVar12 = uVar21;
      }
      iVar13 = uVar23 + 0x1b;
      if (3 < iVar25 + uVar23 + 2) {
        iVar13 = iVar35 + uVar23 + -2;
      }
      iVar13 = iVar13 + iVar25;
      iVar25 = iVar13 + 0x3f;
      if (-1 < iVar13) {
        iVar25 = iVar13;
      }
      *(uint *)((long)colorEndpointModes + lVar19 * 2) =
           ((((uint)(uVar39 >> 0x17) & 3) - 1) +
           (uint)((blockData->m_words[iVar28 >> 6] >> (uVar27 & 0x3f) & 1) != 0)) * 4 +
           ((uint)(blockData->m_words[iVar25 >> 6] >> ((byte)iVar13 & 0x3f)) & 1) * 2 |
           (uint)((blockData->m_words[(int)uVar12 >> 6] >> ((ulong)uVar21 & 0x3f) & 1) != 0);
      lVar19 = lVar19 + 2;
      uVar27 = uVar27 + 1;
    } while ((ulong)uVar23 * 2 + 2 != lVar19);
    bVar41 = false;
  }
LAB_019c860d:
  uVar39 = 0;
  uVar12 = 0;
  do {
    uVar12 = uVar12 + (colorEndpointModes[uVar39] >> 2) * 2 + 2;
    uVar39 = uVar39 + 1;
  } while (uVar40 != uVar39);
  if ((0x12 < (int)uVar12) ||
     ((int)dVar33 <
      (int)(((int)(uVar12 * 0xd) / 5 + 1) - (uint)(uVar12 * 0x66666669 + 0x19999999 < 0x33333333))))
  {
    uVar12 = blockHeight * blockWidth;
    if (isSRGB) {
      if (0 < (int)uVar12) {
        lVar19 = 0;
        do {
          *(undefined4 *)((long)dst + (long)(int)lVar19) = 0xffff00ff;
          lVar19 = lVar19 + 4;
        } while ((ulong)uVar12 << 2 != lVar19);
      }
    }
    else if (0 < (int)uVar12) {
      lVar19 = 0;
      do {
        puVar1 = (undefined8 *)((long)dst + (long)(int)lVar19 * 4);
        *puVar1 = 0x3f800000;
        puVar1[1] = 0x3f8000003f800000;
        lVar19 = lVar19 + 4;
      } while ((ulong)uVar12 << 2 != lVar19);
    }
    return DECOMPRESS_RESULT_ERROR;
  }
  colorEndpoints[3].e1.m_data[0] = 0;
  colorEndpoints[3].e1.m_data[1] = 0;
  colorEndpoints[3].e1.m_data[2] = 0;
  colorEndpoints[3].e1.m_data[3] = 0;
  colorEndpoints[3].e0.m_data[0] = 0;
  colorEndpoints[3].e0.m_data[1] = 0;
  colorEndpoints[3].e0.m_data[2] = 0;
  colorEndpoints[3].e0.m_data[3] = 0;
  colorEndpoints[2].e1.m_data[0] = 0;
  colorEndpoints[2].e1.m_data[1] = 0;
  colorEndpoints[2].e1.m_data[2] = 0;
  colorEndpoints[2].e1.m_data[3] = 0;
  colorEndpoints[2].e0.m_data[0] = 0;
  colorEndpoints[2].e0.m_data[1] = 0;
  colorEndpoints[2].e0.m_data[2] = 0;
  colorEndpoints[2].e0.m_data[3] = 0;
  colorEndpoints[1].e1.m_data[0] = 0;
  colorEndpoints[1].e1.m_data[1] = 0;
  colorEndpoints[1].e1.m_data[2] = 0;
  colorEndpoints[1].e1.m_data[3] = 0;
  colorEndpoints[1].e0.m_data[0] = 0;
  colorEndpoints[1].e0.m_data[1] = 0;
  colorEndpoints[1].e0.m_data[2] = 0;
  colorEndpoints[1].e0.m_data[3] = 0;
  colorEndpoints[0].e1.m_data[0] = 0;
  colorEndpoints[0].e1.m_data[1] = 0;
  colorEndpoints[0].e1.m_data[2] = 0;
  colorEndpoints[0].e1.m_data[3] = 0;
  colorEndpoints[0].e0.m_data[0] = 0;
  colorEndpoints[0].e0.m_data[1] = 0;
  colorEndpoints[0].e0.m_data[2] = 0;
  colorEndpoints[0].e0.m_data[3] = 0;
  IVar15 = computeMaximumRangeISEParams(dVar33,uVar12);
  rgba[2] = 0x1d;
  if (bVar41) {
    rgba[2] = 0x11;
  }
  local_7a8[0] = true;
  local_7a4 = 0;
  local_8b8[0] = IVar15;
  rgba._0_8_ = blockData;
  rgba[3] = dVar33;
  decodeISE((ISEDecodedResult *)texelWeights,uVar12,(BitAccessStream *)rgba,local_8b8);
  iVar35 = IVar15.numBits;
  if (IVar15.mode < ISEMODE_PLAIN_BIT) {
    if (0 < (int)uVar12) {
      uVar21 = (-1 - (uint)(IVar15.mode == ISEMODE_TRIT)) + iVar35 * 2;
      iVar35 = *(int *)(astc::(anonymous_namespace)::
                        unquantizeColorEndpoints(unsigned_int*,tcu::astc::(anonymous_namespace)::ISEDecodedResult_const*,int,tcu::astc::(anonymous_namespace)::ISEParams_const&)
                        ::Ca + (long)(int)uVar21 * 4);
      pdVar24 = texelWeights[0].w + 1;
      uVar39 = 0;
      do {
        uVar31 = ((TexelWeightPair *)(pdVar24 + -1))->w[0];
        uVar23 = 0;
        if (uVar21 < 2) goto LAB_019c8936;
        if (8 < uVar21 - 2) {
          uVar23 = 0xffffffff;
          goto LAB_019c8936;
        }
        uVar32 = uVar31 >> 1 & 1;
        uVar30 = uVar31 >> 2 & 1;
        uVar36 = uVar31 >> 3 & 1;
        uVar37 = uVar31 >> 4 & 1;
        switch(uVar21) {
        case 2:
          uVar23 = uVar32 * 0x116;
          break;
        case 3:
          uVar23 = uVar32 * 0x10c;
          break;
        case 4:
          iVar25 = (uVar32 << 7 | uVar30 << 8) + uVar30 * 8 + uVar32 * 4;
          goto LAB_019c886e;
        case 5:
          uVar23 = (uVar32 << 7 | uVar30 << 8) + uVar30 * 4 + uVar32 * 2;
          goto LAB_019c88d6;
        case 6:
          iVar25 = (uVar32 << 6 | uVar30 << 7 | uVar36 << 8) + uVar36 * 4;
LAB_019c886e:
          uVar23 = iVar25 + uVar30 * 2 | uVar32;
          break;
        case 7:
          uVar23 = (uVar32 << 6 | uVar30 << 7 | uVar36 << 8) + uVar36 * 2;
LAB_019c88d6:
          uVar23 = uVar23 | uVar30;
          break;
        case 8:
          uVar23 = (uVar32 << 5 | uVar30 << 6 | uVar36 << 7 | uVar37 << 8) + uVar37 * 2 | uVar36;
          break;
        case 9:
          uVar23 = uVar32 << 5 | uVar30 << 6 | uVar36 << 7 | uVar37 << 8 | uVar37;
          break;
        case 10:
          uVar23 = uVar31 >> 5 & 1;
          uVar23 = uVar32 << 4 | uVar30 << 5 | uVar36 << 6 | uVar37 << 7 | uVar23 << 8 | uVar23;
        }
LAB_019c8936:
        rgba[uVar39] = -(uVar31 & 1) & 0x80 |
                       (*pdVar24 * iVar35 + uVar23 ^ -(uVar31 & 1) & 0x1ff) >> 2;
        uVar39 = uVar39 + 1;
        pdVar24 = pdVar24 + 3;
      } while (uVar12 != uVar39);
    }
  }
  else if (0 < (int)uVar12) {
    iVar25 = -iVar35;
    iVar28 = 8 - iVar35;
    uVar39 = 0;
    do {
      uVar21 = 0;
      if (iVar28 != iVar25 && SBORROW4(iVar28,iVar25) == iVar28 + iVar35 < 0) {
        uVar23 = *(uint *)((long)texelWeights + uVar39 * 0xc + 8);
        uVar21 = 0;
        iVar13 = iVar35 + -8;
        iVar20 = iVar28;
        do {
          uVar31 = uVar23 >> ((byte)iVar13 & 0x1f);
          if (-1 < iVar20) {
            uVar31 = uVar23 << ((byte)iVar20 & 0x1f);
          }
          uVar21 = uVar21 | uVar31;
          iVar20 = iVar20 - iVar35;
          iVar13 = iVar13 + iVar35;
        } while (iVar20 != iVar25 && SBORROW4(iVar20,iVar25) == iVar20 + iVar35 < 0);
      }
      rgba[uVar39] = uVar21;
      uVar39 = uVar39 + 1;
    } while (uVar39 != uVar12);
  }
  uVar39 = 0;
  e1 = &colorEndpoints[0].e1;
  iVar35 = 0;
  do {
    uVar12 = colorEndpointModes[uVar39];
    if (0xf < uVar12) goto LAB_019c9731;
    e0 = (ColorEndpointPair *)(e1 + -1);
    lVar16 = (long)iVar35;
    lVar19 = lVar16 * 4;
    pdVar24 = rgba + lVar16;
    switch(uVar12) {
    case 0:
      dVar33 = *pdVar24;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar33;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = dVar33;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar33;
      uVar23 = 0xff;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
      uVar21 = rgba[lVar16 + 1];
      goto LAB_019c8e47;
    case 1:
      uVar31 = rgba[lVar16 + 1] & 0xc0 | *pdVar24 >> 2;
      uVar21 = (rgba[lVar16 + 1] & 0x3f) + uVar31;
      uVar23 = 0xff;
      if (0xfe < uVar21) {
        uVar21 = 0xff;
      }
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar31;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar31;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar31;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
      goto LAB_019c9059;
    case 2:
      uVar23 = *pdVar24 * 0x10;
      uVar30 = rgba[lVar16 + 1] * 0x10;
      uVar31 = uVar23 - 8;
      uVar21 = uVar30 + 8;
      if (*pdVar24 <= rgba[lVar16 + 1]) {
        uVar31 = uVar30;
        uVar21 = uVar23;
      }
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar21;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar21;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar21;
      uVar21 = 0x780;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0x780;
      e1->m_data[0] = uVar31;
      e1->m_data[1] = uVar31;
      goto LAB_019c928f;
    case 3:
      bVar41 = -1 < (char)*pdVar24;
      uVar21 = 0x1fc;
      if (bVar41) {
        uVar21 = 0xfe;
      }
      uVar23 = 0x7c;
      if (bVar41) {
        uVar23 = 0x1e;
      }
      uVar31 = *pdVar24 << (2U - bVar41 & 0x1f) & uVar21 |
               (bVar41 + 0xe) * 0x100 & rgba[lVar16 + 1] << 4;
      uVar21 = (rgba[lVar16 + 1] << (2U - bVar41 & 0x1f) & uVar23) + uVar31;
      if (0xffe < uVar21) {
        uVar21 = 0xfff;
      }
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar31;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar31;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar31;
      uVar23 = 0x780;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0x780;
LAB_019c8e47:
      e1->m_data[0] = uVar21;
      e1->m_data[1] = uVar21;
      e1->m_data[2] = uVar21;
      e1->m_data[3] = uVar23;
      break;
    case 4:
      dVar33 = *pdVar24;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar33;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = dVar33;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar33;
      uVar21 = rgba[lVar16 + 3];
      uVar23 = (uint)*(undefined8 *)(rgba + lVar16 + 1);
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] =
           (uint)((ulong)*(undefined8 *)(rgba + lVar16 + 1) >> 0x20);
      e1->m_data[0] = uVar23;
      e1->m_data[1] = uVar23;
      e1->m_data[2] = uVar23;
      goto LAB_019c972d;
    case 5:
      uVar21 = rgba[lVar16 + 1];
      uVar31 = uVar21 & 0x80 | (int)*pdVar24 >> 1;
      uVar23 = uVar31;
      if (0xfe < (int)uVar31) {
        uVar23 = 0xff;
      }
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      uVar30 = rgba[lVar16 + 3];
      uVar36 = uVar30 & 0x80 | (int)rgba[lVar16 + 2] >> 1;
      uVar32 = uVar36;
      if (0xfe < (int)uVar36) {
        uVar32 = 0xff;
      }
      if ((int)uVar32 < 1) {
        uVar32 = 0;
      }
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar23;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar23;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar23;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar32;
      uVar21 = uVar31 + (uVar21 >> 1 & 0x3f) + ((int)(uVar21 << 0x19) >> 0x1f & 0xffffffc0U);
      if (0xfe < (int)uVar21) {
        uVar21 = 0xff;
      }
      if ((int)uVar21 < 1) {
        uVar21 = 0;
      }
      uVar23 = uVar36 + (uVar30 >> 1 & 0x3f) + ((int)(uVar30 << 0x19) >> 0x1f & 0xffffffc0U);
      if (0xfe < (int)uVar23) {
        uVar23 = 0xff;
      }
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
LAB_019c9059:
      e1->m_data[0] = uVar21;
      e1->m_data[1] = uVar21;
      e1->m_data[2] = uVar21;
      e1->m_data[3] = uVar23;
      break;
    case 6:
      dVar33 = rgba[lVar16 + 3];
      dVar18 = *pdVar24;
      uVar23 = rgba[lVar16 + 1];
      uVar31 = rgba[lVar16 + 2];
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar33 * dVar18 >> 8;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar23 * dVar33 >> 8;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar33 * uVar31 >> 8;
      uVar21 = 0xff;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
      goto LAB_019c9288;
    case 7:
      uVar12 = *pdVar24 >> 6 & 3;
      if ((rgba[lVar16 + 2] >> 6 & 2 | rgba[lVar16 + 1] >> 7 & 1) == 3) {
        uVar12 = uVar12 == 3 | 4;
      }
      DVar14 = (*(code *)(&DAT_01ccb5c8 + *(int *)(&DAT_01ccb5c8 + (ulong)uVar12 * 4)))
                         (rgba[lVar16 + 1] >> 5 & 1,*pdVar24 & 0x3f,
                          &DAT_01ccb5c8 + *(int *)(&DAT_01ccb5c8 + (ulong)uVar12 * 4),(ulong)uVar12,
                          rgba[lVar16 + 3] >> 7 & 1);
      return DVar14;
    case 8:
      uVar21 = rgba[lVar16 + 1];
      uVar23 = rgba[lVar16 + 3];
      uVar31 = (&local_7a0)[lVar16 + -1];
      iVar25 = uVar31 + uVar21;
      uVar30 = rgba[lVar16 + 2];
      uVar32 = *(uint *)(local_7a8 + lVar19);
      iVar28 = uVar32 + *pdVar24;
      if (iVar25 + uVar23 < iVar28 + uVar30) {
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = iVar25 >> 1;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = (int)(uVar23 + uVar31) >> 1;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar31;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
        e1->m_data[0] = iVar28 >> 1;
        e1->m_data[1] = (int)(uVar30 + uVar32) >> 1;
        e1->m_data[2] = uVar32;
        e1->m_data[3] = 0xff;
      }
      else {
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = *pdVar24;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar30;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar32;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
        e1->m_data[0] = uVar21;
        e1->m_data[1] = uVar23;
        e1->m_data[2] = uVar31;
        e1->m_data[3] = 0xff;
      }
      break;
    case 9:
      uVar21 = rgba[lVar16 + 1];
      uVar23 = rgba[lVar16 + 3];
      uVar31 = (&local_7a0)[lVar16 + -1];
      uVar30 = uVar21 & 0x80 | (int)*pdVar24 >> 1;
      uVar32 = (int)(uVar21 << 0x19) >> 0x1f & 0xffffffc0U | uVar21 >> 1 & 0x3f;
      uVar21 = uVar23 & 0x80 | (int)rgba[lVar16 + 2] >> 1;
      uVar36 = (int)(uVar23 << 0x19) >> 0x1f & 0xffffffc0U | uVar23 >> 1 & 0x3f;
      uVar23 = uVar31 & 0x80 | *(int *)(local_7a8 + lVar19) >> 1;
      uVar31 = (int)(uVar31 << 0x19) >> 0x1f & 0xffffffc0U | uVar31 >> 1 & 0x3f;
      if ((int)(uVar36 + uVar32 + uVar31) < 0) {
        uVar31 = uVar31 + uVar23;
        uVar32 = (int)(uVar32 + uVar30 + uVar31) >> 1;
        if (0xfe < (int)uVar32) {
          uVar32 = 0xff;
        }
        if ((int)uVar32 < 1) {
          uVar32 = 0;
        }
        uVar36 = (int)(uVar36 + uVar21 + uVar31) >> 1;
        if (0xfe < (int)uVar36) {
          uVar36 = 0xff;
        }
        if ((int)uVar36 < 1) {
          uVar36 = 0;
        }
        if (0xfe < (int)uVar31) {
          uVar31 = 0xff;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar32;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar36;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar31;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
        uVar31 = (int)(uVar30 + uVar23) >> 1;
        if (0xfe < (int)uVar31) {
          uVar31 = 0xff;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        uVar21 = (int)(uVar21 + uVar23) >> 1;
        if (0xfe < (int)uVar21) {
          uVar21 = 0xff;
        }
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        if (0xfe < (int)uVar23) {
          uVar23 = 0xff;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        e1->m_data[0] = uVar31;
        e1->m_data[1] = uVar21;
        e1->m_data[2] = uVar23;
      }
      else {
        uVar37 = uVar30;
        if (0xfe < (int)uVar30) {
          uVar37 = 0xff;
        }
        if ((int)uVar37 < 1) {
          uVar37 = 0;
        }
        uVar26 = uVar21;
        if (0xfe < (int)uVar21) {
          uVar26 = 0xff;
        }
        if ((int)uVar26 < 1) {
          uVar26 = 0;
        }
        uVar29 = uVar23;
        if (0xfe < (int)uVar23) {
          uVar29 = 0xff;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar37;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar26;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar29;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
        uVar32 = uVar32 + uVar30;
        if (0xfe < (int)uVar32) {
          uVar32 = 0xff;
        }
        if ((int)uVar32 < 1) {
          uVar32 = 0;
        }
        uVar36 = uVar36 + uVar21;
        if (0xfe < (int)uVar36) {
          uVar36 = 0xff;
        }
        if ((int)uVar36 < 1) {
          uVar36 = 0;
        }
        uVar31 = uVar31 + uVar23;
        if (0xfe < (int)uVar31) {
          uVar31 = 0xff;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        e1->m_data[0] = uVar32;
        e1->m_data[1] = uVar36;
        e1->m_data[2] = uVar31;
      }
      e1->m_data[3] = 0xff;
      break;
    case 10:
      dVar33 = rgba[lVar16 + 3];
      dVar18 = *pdVar24;
      uVar23 = rgba[lVar16 + 1];
      uVar31 = rgba[lVar16 + 2];
      uVar21 = *(uint *)(local_7a8 + lVar19);
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar33 * dVar18 >> 8;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar23 * dVar33 >> 8;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar33 * uVar31 >> 8;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar21;
      uVar21 = (&local_7a0)[lVar16 + -1];
LAB_019c9288:
      e1->m_data[0] = dVar18;
      e1->m_data[1] = uVar23;
LAB_019c928f:
      e1->m_data[2] = uVar31;
      goto LAB_019c972d;
    case 0xb:
      decodeHDREndpointMode11
                ((UVec4 *)e0,e1,*pdVar24,rgba[lVar16 + 1],rgba[lVar16 + 2],rgba[lVar16 + 3],
                 *(deUint32 *)(local_7a8 + lVar19),(&local_7a0)[lVar16 + -1]);
      break;
    case 0xc:
      uVar21 = rgba[lVar16 + 1];
      uVar23 = rgba[lVar16 + 3];
      uVar31 = (&local_7a0)[lVar16 + -1];
      iVar25 = uVar31 + uVar21;
      uVar30 = rgba[lVar16 + 2];
      uVar32 = *(uint *)(local_7a8 + lVar19);
      iVar28 = uVar32 + *pdVar24;
      if (iVar25 + uVar23 < iVar28 + uVar30) {
        uVar21 = iVar25 >> 1;
        if (0xfe < (int)uVar21) {
          uVar21 = 0xff;
        }
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        uVar23 = (int)(uVar23 + uVar31) >> 1;
        if (0xfe < (int)uVar23) {
          uVar23 = 0xff;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if (0xfe < (int)uVar31) {
          uVar31 = 0xff;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        uVar36 = local_79c[lVar16];
        if (0xfe < (int)uVar36) {
          uVar36 = 0xff;
        }
        if ((int)uVar36 < 1) {
          uVar36 = 0;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar21;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar23;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar31;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar36;
        uVar21 = iVar28 >> 1;
        if (0xfe < (int)uVar21) {
          uVar21 = 0xff;
        }
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        uVar23 = (&local_7a0)[lVar16];
        uVar31 = (int)(uVar30 + uVar32) >> 1;
        if (0xfe < (int)uVar31) {
          uVar31 = 0xff;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        if (0xfe < (int)uVar32) {
          uVar32 = 0xff;
        }
        if ((int)uVar32 < 1) {
          uVar32 = 0;
        }
        if (0xfe < (int)uVar23) {
          uVar23 = 0xff;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        e1->m_data[0] = uVar21;
        e1->m_data[1] = uVar31;
        e1->m_data[2] = uVar32;
        e1->m_data[3] = uVar23;
      }
      else {
        uVar36 = (&local_7a0)[lVar16];
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = *pdVar24;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar30;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar32;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar36;
        uVar30 = local_79c[lVar16];
        e1->m_data[0] = uVar21;
        e1->m_data[1] = uVar23;
        e1->m_data[2] = uVar31;
        e1->m_data[3] = uVar30;
      }
      break;
    case 0xd:
      uVar21 = rgba[lVar16 + 1];
      uVar23 = rgba[lVar16 + 3];
      uVar31 = (&local_7a0)[lVar16 + -1];
      uVar30 = local_79c[lVar16];
      uVar37 = uVar21 & 0x80 | (int)*pdVar24 >> 1;
      uVar32 = (int)(uVar21 << 0x19) >> 0x1f & 0xffffffc0U | uVar21 >> 1 & 0x3f;
      uVar26 = uVar23 & 0x80 | (int)rgba[lVar16 + 2] >> 1;
      uVar36 = (int)(uVar23 << 0x19) >> 0x1f & 0xffffffc0U | uVar23 >> 1 & 0x3f;
      uVar29 = uVar31 & 0x80 | *(int *)(local_7a8 + lVar19) >> 1;
      uVar23 = (int)(uVar31 << 0x19) >> 0x1f & 0xffffffc0U | uVar31 >> 1 & 0x3f;
      uVar31 = uVar30 & 0x80 | (int)(&local_7a0)[lVar16] >> 1;
      uVar21 = (int)(uVar30 << 0x19) >> 0x1f & 0xffffffc0U | uVar30 >> 1 & 0x3f;
      if (-1 < (int)(uVar36 + uVar32 + uVar23)) {
        uVar30 = uVar37;
        if (0xfe < (int)uVar37) {
          uVar30 = 0xff;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        uVar22 = uVar26;
        if (0xfe < (int)uVar26) {
          uVar22 = 0xff;
        }
        if ((int)uVar22 < 1) {
          uVar22 = 0;
        }
        uVar38 = uVar29;
        if (0xfe < (int)uVar29) {
          uVar38 = 0xff;
        }
        if ((int)uVar38 < 1) {
          uVar38 = 0;
        }
        uVar34 = uVar31;
        if (0xfe < (int)uVar31) {
          uVar34 = 0xff;
        }
        if ((int)uVar34 < 1) {
          uVar34 = 0;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar30;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar22;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar38;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar34;
        uVar32 = uVar32 + uVar37;
        if (0xfe < (int)uVar32) {
          uVar32 = 0xff;
        }
        if ((int)uVar32 < 1) {
          uVar32 = 0;
        }
        uVar36 = uVar36 + uVar26;
        if (0xfe < (int)uVar36) {
          uVar36 = 0xff;
        }
        if ((int)uVar36 < 1) {
          uVar36 = 0;
        }
        uVar23 = uVar23 + uVar29;
        if (0xfe < (int)uVar23) {
          uVar23 = 0xff;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        uVar21 = uVar21 + uVar31;
        if (0xfe < (int)uVar21) {
          uVar21 = 0xff;
        }
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        e1->m_data[0] = uVar32;
        e1->m_data[1] = uVar36;
        e1->m_data[2] = uVar23;
        goto LAB_019c972d;
      }
      uVar23 = uVar23 + uVar29;
      uVar30 = (int)(uVar32 + uVar37 + uVar23) >> 1;
      if (0xfe < (int)uVar30) {
        uVar30 = 0xff;
      }
      if ((int)uVar30 < 1) {
        uVar30 = 0;
      }
      uVar32 = (int)(uVar36 + uVar26 + uVar23) >> 1;
      if (0xfe < (int)uVar32) {
        uVar32 = 0xff;
      }
      if ((int)uVar32 < 1) {
        uVar32 = 0;
      }
      if (0xfe < (int)uVar23) {
        uVar23 = 0xff;
      }
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      uVar21 = uVar21 + uVar31;
      if (0xfe < (int)uVar21) {
        uVar21 = 0xff;
      }
      if ((int)uVar21 < 1) {
        uVar21 = 0;
      }
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar30;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar32;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar23;
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar21;
      uVar21 = (int)(uVar37 + uVar29) >> 1;
      if (0xfe < (int)uVar21) {
        uVar21 = 0xff;
      }
      if ((int)uVar21 < 1) {
        uVar21 = 0;
      }
      uVar23 = (int)(uVar26 + uVar29) >> 1;
      if (0xfe < (int)uVar23) {
        uVar23 = 0xff;
      }
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      if (0xfe < (int)uVar29) {
        uVar29 = 0xff;
      }
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      if (0xfe < (int)uVar31) {
        uVar31 = 0xff;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      e1->m_data[0] = uVar21;
      e1->m_data[1] = uVar23;
      e1->m_data[2] = uVar29;
      e1->m_data[3] = uVar31;
      break;
    case 0xe:
      decodeHDREndpointMode11
                ((UVec4 *)e0,e1,*pdVar24,rgba[lVar16 + 1],rgba[lVar16 + 2],rgba[lVar16 + 3],
                 *(deUint32 *)(local_7a8 + lVar19),(&local_7a0)[lVar16 + -1]);
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = (&local_7a0)[lVar16];
      uVar21 = local_79c[lVar16];
LAB_019c972d:
      e1->m_data[3] = uVar21;
      break;
    case 0xf:
      uVar21 = (&local_7a0)[lVar16];
      uVar23 = local_79c[lVar16];
      decodeHDREndpointMode11
                ((UVec4 *)e0,e1,*pdVar24,rgba[lVar16 + 1],rgba[lVar16 + 2],rgba[lVar16 + 3],
                 *(deUint32 *)(local_7a8 + lVar19),(&local_7a0)[lVar16 + -1]);
      uVar31 = uVar21 >> 7 & 1 | uVar23 >> 6 & 2;
      uVar21 = uVar21 & 0x7f;
      if (uVar31 == 3) {
        uVar21 = uVar21 << 5;
        uVar23 = (uVar23 & 0x7f) << 5;
      }
      else {
        sVar10 = (sbyte)uVar31;
        uVar31 = (uVar23 & 0x7f) << sVar10 + 1 & 0x780 | uVar21;
        uVar21 = uVar31 << (4U - sVar10 & 0x1f);
        uVar23 = ((0x3fU >> sVar10 & uVar23 ^ 0x20U >> sVar10) - (0x20U >> sVar10)) + uVar31 <<
                 (4U - sVar10 & 0x1f);
        if (0xffe < (int)uVar23) {
          uVar23 = 0xfff;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
      }
      (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar21;
      e1->m_data[3] = uVar23;
    }
LAB_019c9731:
    iVar35 = iVar35 + (uVar12 >> 2) * 2 + 2;
    uVar39 = uVar39 + 1;
    e1 = e1 + 2;
    if (uVar40 == uVar39) {
      DVar14 = (*(code *)(&DAT_01ccb5e0 + *(int *)(&DAT_01ccb5e0 + (ulong)uVar17 * 4)))();
      return DVar14;
    }
  } while( true );
}

Assistant:

DecompressResult decompressBlock (void* dst, const Block128& blockData, int blockWidth, int blockHeight, bool isSRGB, bool isLDR)
{
	DE_ASSERT(isLDR || !isSRGB);

	// Decode block mode.

	const ASTCBlockMode blockMode = getASTCBlockMode(blockData.getBits(0, 10));

	// Check for block mode errors.

	if (blockMode.isError)
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Separate path for void-extent.

	if (blockMode.isVoidExtent)
		return decodeVoidExtentBlock(dst, blockData, blockWidth, blockHeight, isSRGB, isLDR);

	// Compute weight grid values.

	const int numWeights			= computeNumWeights(blockMode);
	const int numWeightDataBits		= computeNumRequiredBits(blockMode.weightISEParams, numWeights);
	const int numPartitions			= (int)blockData.getBits(11, 12) + 1;

	// Check for errors in weight grid, partition and dual-plane parameters.

	if (numWeights > 64								||
		numWeightDataBits > 96						||
		numWeightDataBits < 24						||
		blockMode.weightGridWidth > blockWidth		||
		blockMode.weightGridHeight > blockHeight	||
		(numPartitions == 4 && blockMode.isDualPlane))
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Compute number of bits available for color endpoint data.

	const bool	isSingleUniqueCem			= numPartitions == 1 || blockData.getBits(23, 24) == 0;
	const int	numConfigDataBits			= (numPartitions == 1 ? 17 : isSingleUniqueCem ? 29 : 25 + 3*numPartitions) +
											  (blockMode.isDualPlane ? 2 : 0);
	const int	numBitsForColorEndpoints	= 128 - numWeightDataBits - numConfigDataBits;
	const int	extraCemBitsStart			= 127 - numWeightDataBits - (isSingleUniqueCem		? -1
																		: numPartitions == 4	? 7
																		: numPartitions == 3	? 4
																		: numPartitions == 2	? 1
																		: 0);
	// Decode color endpoint modes.

	deUint32 colorEndpointModes[4];
	decodeColorEndpointModes(&colorEndpointModes[0], blockData, numPartitions, extraCemBitsStart);

	const int numColorEndpointValues = computeNumColorEndpointValues(colorEndpointModes, numPartitions);

	// Check for errors in color endpoint value count.

	if (numColorEndpointValues > 18 || numBitsForColorEndpoints < deDivRoundUp32(13*numColorEndpointValues, 5))
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Compute color endpoints.

	ColorEndpointPair colorEndpoints[4];
	computeColorEndpoints(&colorEndpoints[0], blockData, &colorEndpointModes[0], numPartitions, numColorEndpointValues,
						  computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues), numBitsForColorEndpoints);

	// Compute texel weights.

	TexelWeightPair texelWeights[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT];
	computeTexelWeights(&texelWeights[0], blockData, blockWidth, blockHeight, blockMode);

	// Set texel colors.

	const int		ccs						= blockMode.isDualPlane ? (int)blockData.getBits(extraCemBitsStart-2, extraCemBitsStart-1) : -1;
	const deUint32	partitionIndexSeed		= numPartitions > 1 ? blockData.getBits(13, 22) : (deUint32)-1;

	return setTexelColors(dst, &colorEndpoints[0], &texelWeights[0], ccs, partitionIndexSeed, numPartitions, blockWidth, blockHeight, isSRGB, isLDR, &colorEndpointModes[0]);
}